

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_trie.hpp
# Opt level: O1

void __thiscall
poplar::
compact_bonsai_trie<80U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
::compact_bonsai_trie
          (compact_bonsai_trie<80U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
           *this,uint32_t capa_bits,uint32_t symb_bits,uint32_t cht_capa_bits)

{
  undefined1 auVar1 [16];
  uint uVar2;
  ulong uVar3;
  uint64_t uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 in_XMM2 [16];
  undefined1 local_b8 [16];
  pointer local_a8;
  pointer local_a0;
  pointer puStack_98;
  pointer local_90;
  uint64_t local_88;
  uint64_t uStack_80;
  uint64_t local_78;
  uint64_t local_70;
  uint64_t uStack_68;
  size_p2 sStack_60;
  size_p2 sStack_50;
  size_p2 sStack_40;
  uint64_t uStack_30;
  uint64_t uStack_28;
  
  (this->hasher_).shift_ = 0;
  (this->hasher_).univ_size_.bits_ = 0;
  (this->aux_cht_).hasher_.univ_size_.bits_ = 0;
  (this->aux_cht_).univ_size_.mask_ = 0;
  (this->aux_cht_).capa_size_.bits_ = 0;
  (this->aux_cht_).capa_size_.mask_ = 0;
  (this->aux_cht_).quo_size_.bits_ = 0;
  (this->aux_cht_).hasher_.univ_size_.mask_ = 0;
  (this->aux_cht_).table_.chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->aux_cht_).table_.chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->aux_cht_).table_.chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->aux_cht_).table_.size_ = 0;
  (this->aux_cht_).table_.mask_ = 0;
  (this->aux_cht_).table_.width_ = 0;
  (this->aux_cht_).size_ = 0;
  *(undefined8 *)
   ((long)&(this->aux_cht_).table_.chunks_.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->aux_cht_).table_.chunks_.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->aux_cht_).table_.chunks_.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)((long)&(this->aux_cht_).table_.size_ + 4) = 0;
  *(undefined8 *)((long)&(this->aux_cht_).table_.mask_ + 4) = 0;
  *(undefined8 *)((long)&(this->aux_cht_).table_.width_ + 4) = 0;
  *(undefined8 *)((long)&(this->aux_cht_).size_ + 4) = 0;
  *(undefined8 *)((long)&(this->aux_cht_).max_size_ + 4) = 0;
  uVar3 = 0x10;
  if (0x10 < capa_bits) {
    uVar3 = (ulong)capa_bits;
  }
  uVar5 = -1L << (uVar3 & 0x3f);
  (this->hasher_).univ_size_.mask_ = 0;
  (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)((long)&(this->table_).size_ + 4) = 0;
  *(undefined8 *)((long)&(this->table_).mask_ + 4) = 0;
  *(undefined8 *)((long)&(this->table_).width_ + 4) = 0;
  (this->aux_cht_).quo_size_.mask_ = 0;
  (this->aux_cht_).quo_shift_ = 0;
  (this->aux_cht_).quo_invmask_ = 0;
  (this->aux_map_).table_.
  super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->aux_map_).table_.
  super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->aux_map_).table_.
  super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->aux_map_).size_ = 0;
  (this->aux_map_).max_size_ = 0;
  (this->aux_map_).capa_size_.bits_ = 0;
  *(undefined8 *)((long)&this->size_ + 4) = 0;
  *(undefined8 *)((long)&this->max_size_ + 4) = 0;
  (this->aux_map_).capa_size_.mask_ = 0;
  this->size_ = 0;
  (this->capa_size_).bits_ = (uint32_t)uVar3;
  (this->capa_size_).mask_ = ~uVar5;
  (this->symb_size_).bits_ = symb_bits;
  (this->symb_size_).mask_ = -1L << ((ulong)symb_bits & 0x3f) ^ 0xffffffffffffffff;
  auVar1 = vcvtusi2sd_avx512f(in_XMM2,uVar5 * -0x50);
  auVar6._0_8_ = auVar1._0_8_ / 100.0;
  auVar6._8_8_ = auVar1._8_8_;
  uVar4 = vcvttsd2usi_avx512f(auVar6);
  this->max_size_ = uVar4;
  uVar2 = (uint32_t)uVar3 + symb_bits;
  (this->hasher_).shift_ = (uVar2 >> 1) + 1;
  (this->hasher_).univ_size_.bits_ = uVar2;
  (this->hasher_).univ_size_.mask_ = ~(-1L << ((ulong)uVar2 & 0x3f));
  compact_vector::compact_vector((compact_vector *)local_b8,-uVar5,symb_bits + 5);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
            (&(this->table_).chunks_,local_b8);
  (this->table_).width_ = (uint64_t)local_90;
  (this->table_).size_ = (uint64_t)local_a0;
  (this->table_).mask_ = (uint64_t)puStack_98;
  if ((pointer)local_b8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_b8._0_8_,(long)local_a8 - local_b8._0_8_);
  }
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::compact_hash_table
            ((compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *)local_b8,
             (this->capa_size_).bits_,cht_capa_bits);
  (this->aux_cht_).hasher_.univ_size_.mask_ = (uint64_t)local_a8;
  *(undefined8 *)&(this->aux_cht_).hasher_ = local_b8._0_8_;
  *(undefined8 *)&(this->aux_cht_).hasher_.univ_size_ = local_b8._8_8_;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
            (&(this->aux_cht_).table_.chunks_,&local_a0);
  (this->aux_cht_).table_.width_ = local_78;
  (this->aux_cht_).table_.size_ = local_88;
  (this->aux_cht_).table_.mask_ = uStack_80;
  (this->aux_cht_).univ_size_.bits_ = sStack_60.bits_;
  *(undefined4 *)&(this->aux_cht_).univ_size_.field_0x4 = sStack_60._4_4_;
  (this->aux_cht_).univ_size_.mask_ = sStack_60.mask_;
  (this->aux_cht_).capa_size_.bits_ = sStack_50.bits_;
  *(undefined4 *)&(this->aux_cht_).capa_size_.field_0x4 = sStack_50._4_4_;
  (this->aux_cht_).capa_size_.mask_ = sStack_50.mask_;
  (this->aux_cht_).quo_size_.bits_ = sStack_40.bits_;
  *(undefined4 *)&(this->aux_cht_).quo_size_.field_0x4 = sStack_40._4_4_;
  (this->aux_cht_).quo_size_.mask_ = sStack_40.mask_;
  (this->aux_cht_).quo_shift_ = uStack_30;
  (this->aux_cht_).quo_invmask_ = uStack_28;
  (this->aux_cht_).size_ = local_70;
  (this->aux_cht_).max_size_ = uStack_68;
  (this->aux_cht_).univ_size_.bits_ = sStack_60.bits_;
  *(undefined4 *)&(this->aux_cht_).univ_size_.field_0x4 = sStack_60._4_4_;
  (this->aux_cht_).univ_size_.mask_ = sStack_60.mask_;
  (this->aux_cht_).capa_size_.bits_ = sStack_50.bits_;
  *(undefined4 *)&(this->aux_cht_).capa_size_.field_0x4 = sStack_50._4_4_;
  (this->aux_cht_).capa_size_.mask_ = sStack_50.mask_;
  (this->aux_cht_).quo_size_.bits_ = sStack_40.bits_;
  *(undefined4 *)&(this->aux_cht_).quo_size_.field_0x4 = sStack_40._4_4_;
  (this->aux_cht_).quo_size_.mask_ = sStack_40.mask_;
  if (local_a0 != (pointer)0x0) {
    operator_delete(local_a0,(long)local_90 - (long)local_a0);
  }
  return;
}

Assistant:

compact_bonsai_trie(uint32_t capa_bits, uint32_t symb_bits, uint32_t cht_capa_bits = 0) {
        capa_size_ = size_p2{std::max(min_capa_bits, capa_bits)};
        symb_size_ = size_p2{symb_bits};

        max_size_ = static_cast<uint64_t>(capa_size_.size() * MaxFactor / 100.0);

        hasher_ = Hasher{capa_size_.bits() + symb_size_.bits()};
        table_ = compact_vector{capa_size_.size(), symb_size_.bits() + dsp1_bits};
        aux_cht_ = aux_cht_type{capa_size_.bits(), cht_capa_bits};
    }